

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,REF_BOOL *manifold)

{
  int iVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int local_c0;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL contains;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT face;
  REF_INT seg;
  REF_CELL ref_cell;
  REF_INT node;
  REF_BOOL *manifold_local;
  REF_CAVITY ref_cavity_local;
  
  *manifold = 0;
  if (ref_cavity->surf_node == -1) {
    local_c0 = ref_cavity->node;
  }
  else {
    local_c0 = ref_cavity->surf_node;
  }
  pRVar2 = ref_cavity->ref_grid->cell[3];
  for (cell = 0; cell < ref_cavity->maxseg; cell = cell + 1) {
    if ((((-1 < cell) && (cell < ref_cavity->maxseg)) && (ref_cavity->s2n[cell * 3] != -1)) &&
       ((local_c0 != ref_cavity->s2n[cell * 3] && (local_c0 != ref_cavity->s2n[cell * 3 + 1])))) {
      ref_private_macro_code_rxs = ref_cavity->s2n[cell * 3];
      contains = ref_cavity->s2n[cell * 3 + 1];
      nodes[0] = local_c0;
      nodes[1] = ref_cavity->s2n[cell * 3 + 2];
      uVar3 = ref_cell_with(pRVar2,&ref_private_macro_code_rxs,nodes + 0x19);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x6ae,"ref_cavity_manifold",(ulong)uVar3,"with manifold search failed");
        return uVar3;
      }
      if (nodes[0x19] != -1) {
        uVar3 = ref_list_contains(ref_cavity->tri_list,nodes[0x19],&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x6b1,"ref_cavity_manifold",(ulong)uVar3,"contains a plan to remove");
          return uVar3;
        }
        if (ref_private_macro_code_rss == 0) {
          *manifold = 0;
          return 0;
        }
      }
    }
  }
  iVar1 = ref_cavity->node;
  pRVar2 = ref_cavity->ref_grid->cell[8];
  nodes[0x1a] = 0;
  do {
    if (ref_cavity->maxface <= nodes[0x1a]) {
      *manifold = 1;
      return 0;
    }
    if (((-1 < nodes[0x1a]) && (nodes[0x1a] < ref_cavity->maxface)) &&
       ((ref_cavity->f2n[nodes[0x1a] * 3] != -1 &&
        (((iVar1 != ref_cavity->f2n[nodes[0x1a] * 3] &&
          (iVar1 != ref_cavity->f2n[nodes[0x1a] * 3 + 1])) &&
         (iVar1 != ref_cavity->f2n[nodes[0x1a] * 3 + 2])))))) {
      ref_private_macro_code_rxs = ref_cavity->f2n[nodes[0x1a] * 3];
      contains = ref_cavity->f2n[nodes[0x1a] * 3 + 1];
      nodes[0] = ref_cavity->f2n[nodes[0x1a] * 3 + 2];
      nodes[1] = iVar1;
      uVar3 = ref_cell_with(pRVar2,&ref_private_macro_code_rxs,nodes + 0x19);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x6c8,"ref_cavity_manifold",(ulong)uVar3,"with manifold search failed");
        return uVar3;
      }
      if (nodes[0x19] != -1) {
        uVar3 = ref_list_contains(ref_cavity->tet_list,nodes[0x19],&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x6cb,"ref_cavity_manifold",(ulong)uVar3,"contains a plan to remove");
          return uVar3;
        }
        if (ref_private_macro_code_rss == 0) {
          *manifold = 0;
          return 0;
        }
      }
    }
    nodes[0x1a] = nodes[0x1a] + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,
                                              REF_BOOL *manifold) {
  REF_INT node;
  REF_CELL ref_cell;
  REF_INT seg, face;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL contains;

  *manifold = REF_FALSE;

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    /* skip a seg attached to node */
    if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
        node == ref_cavity_s2n(ref_cavity, 1, seg))
      continue;

    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    /* skip a face attached to node */
    if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
        node == ref_cavity_f2n(ref_cavity, 1, face) ||
        node == ref_cavity_f2n(ref_cavity, 2, face))
      continue;

    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  *manifold = REF_TRUE;

  return REF_SUCCESS;
}